

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O1

void nn_sinproc_init(nn_sinproc *self,int src,nn_ep *ep,nn_fsm *owner)

{
  int rcvbuf;
  size_t sz;
  int local_24;
  size_t local_20;
  
  nn_fsm_init(&self->fsm,nn_sinproc_handler,nn_sinproc_shutdown,src,self,owner);
  self->state = 1;
  self->flags = 0;
  self->peer = (nn_sinproc *)0x0;
  nn_pipebase_init(&self->pipebase,&nn_sinproc_pipebase_vfptr,ep);
  local_20 = 4;
  nn_ep_getopt(ep,0,3,&local_24,&local_20);
  if (local_20 == 4) {
    nn_msgqueue_init(&self->msgqueue,(long)local_24);
    nn_msg_init(&self->msg,0);
    nn_fsm_event_init(&self->event_connect);
    nn_fsm_event_init(&self->event_sent);
    nn_fsm_event_init(&self->event_received);
    nn_fsm_event_init(&self->event_disconnect);
    nn_list_item_init(&self->item);
    return;
  }
  nn_sinproc_init_cold_1();
}

Assistant:

void nn_sinproc_init (struct nn_sinproc *self, int src,
    struct nn_ep *ep, struct nn_fsm *owner)
{
    int rcvbuf;
    size_t sz;

    nn_fsm_init (&self->fsm, nn_sinproc_handler, nn_sinproc_shutdown,
        src, self, owner);
    self->state = NN_SINPROC_STATE_IDLE;
    self->flags = 0;
    self->peer = NULL;
    nn_pipebase_init (&self->pipebase, &nn_sinproc_pipebase_vfptr, ep);
    sz = sizeof (rcvbuf);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RCVBUF, &rcvbuf, &sz);
    nn_assert (sz == sizeof (rcvbuf));
    nn_msgqueue_init (&self->msgqueue, rcvbuf);
    nn_msg_init (&self->msg, 0);
    nn_fsm_event_init (&self->event_connect);
    nn_fsm_event_init (&self->event_sent);
    nn_fsm_event_init (&self->event_received);
    nn_fsm_event_init (&self->event_disconnect);
    nn_list_item_init (&self->item);
}